

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O0

uint8_t F3DAudioCheckCalculateParams
                  (uint8_t *Instance,F3DAUDIO_LISTENER *pListener,F3DAUDIO_EMITTER *pEmitter,
                  uint32_t Flags,F3DAUDIO_DSP_SETTINGS *pDSPSettings)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint8_t uVar4;
  int iVar5;
  uint in_ECX;
  long *in_RDX;
  float *in_RSI;
  uint *in_RDI;
  long *in_R8;
  float fVar6;
  SDL_AssertState sdl_assert_state_37;
  SDL_AssertState sdl_assert_state_36;
  SDL_AssertState sdl_assert_state_35;
  SDL_AssertState sdl_assert_state_34;
  SDL_AssertState sdl_assert_state_33;
  SDL_AssertState sdl_assert_state_32;
  SDL_AssertState sdl_assert_state_31;
  SDL_AssertState sdl_assert_state_30;
  SDL_AssertState sdl_assert_state_29;
  SDL_AssertState sdl_assert_state_28;
  SDL_AssertState sdl_assert_state_27;
  SDL_AssertState sdl_assert_state_26;
  float currentAzimuth;
  SDL_AssertState sdl_assert_state_25;
  SDL_AssertState sdl_assert_state_24;
  SDL_AssertState sdl_assert_state_23;
  SDL_AssertState sdl_assert_state_22;
  SDL_AssertState sdl_assert_state_21;
  SDL_AssertState sdl_assert_state_20;
  SDL_AssertState sdl_assert_state_19;
  SDL_AssertState sdl_assert_state_18;
  SDL_AssertState sdl_assert_state_17;
  SDL_AssertState sdl_assert_state_16;
  SDL_AssertState sdl_assert_state_15;
  SDL_AssertState sdl_assert_state_14;
  SDL_AssertState sdl_assert_state_13;
  SDL_AssertState sdl_assert_state_12;
  SDL_AssertState sdl_assert_state_11;
  SDL_AssertState sdl_assert_state_10;
  SDL_AssertState sdl_assert_state_9;
  SDL_AssertState sdl_assert_state_8;
  SDL_AssertState sdl_assert_state_7;
  SDL_AssertState sdl_assert_state_6;
  uint32_t hasLF;
  uint32_t isCalculateMatrix_1;
  SDL_AssertState sdl_assert_state_5;
  uint32_t hasCenter;
  uint32_t isCalculateMatrix;
  SDL_AssertState sdl_assert_state_4;
  SDL_AssertState sdl_assert_state_3;
  SDL_AssertState sdl_assert_state_2;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  uint32_t ChannelCount;
  uint32_t i;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  uint local_2c;
  
  do {
    if (in_RDI != (uint *)0x0) goto LAB_0010b25c;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x13c);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010b25c:
  do {
    if (in_RSI != (float *)0x0) goto LAB_0010b2c8;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_1,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x13d);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010b2c8:
  do {
    if (in_RDX != (long *)0x0) goto LAB_0010b334;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_2,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x13e);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010b334:
  do {
    if (in_R8 != (long *)0x0) goto LAB_0010b39a;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_3,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x13f);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010b39a:
  if ((in_ECX & 1) != 0) {
    do {
      if (*in_R8 != 0) goto LAB_0010b41c;
      iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_4,
                                  "F3DAudioCheckCalculateParams",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x143);
    } while (iVar5 == 0);
    if (iVar5 == 1) {
      pcVar2 = (code *)swi(3);
      uVar4 = (*pcVar2)();
      return uVar4;
    }
  }
LAB_0010b41c:
  if ((in_ECX & 0x10000) != 0) {
    uVar1 = *in_RDI;
    do {
      bVar3 = false;
      if (((in_ECX & 1) != 0) && (bVar3 = false, (uVar1 & 4) != 0)) {
        bVar3 = true;
      }
      if (bVar3) goto LAB_0010b4d1;
      iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_5,
                                  "F3DAudioCheckCalculateParams",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x14d);
    } while (iVar5 == 0);
    if (iVar5 == 1) {
      pcVar2 = (code *)swi(3);
      uVar4 = (*pcVar2)();
      return uVar4;
    }
  }
LAB_0010b4d1:
  if ((in_ECX & 0x20000) != 0) {
    uVar1 = *in_RDI;
    do {
      bVar3 = false;
      if (((in_ECX & 1) != 0) && (bVar3 = false, (uVar1 & 8) != 0)) {
        bVar3 = true;
      }
      if (bVar3) goto LAB_0010b586;
      iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_6,
                                  "F3DAudioCheckCalculateParams",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x159);
    } while (iVar5 == 0);
    if (iVar5 == 1) {
      pcVar2 = (code *)swi(3);
      uVar4 = (*pcVar2)();
      return uVar4;
    }
  }
LAB_0010b586:
  uVar1 = in_RDI[1];
  do {
    if (*(uint *)((long)in_R8 + 0x14) == uVar1) goto LAB_0010b60f;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_7,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x160);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010b60f:
  do {
    if ((int)in_R8[2] == (int)in_RDX[8]) goto LAB_0010b682;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_8,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x164);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010b682:
  if (*(long *)(in_RSI + 0xc) != 0) {
    do {
      uVar4 = CheckCone((F3DAUDIO_CONE *)
                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      if (uVar4 == '\x01') goto LAB_0010b713;
      iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_9,
                                  "F3DAudioCheckCalculateParams",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x16b);
    } while (iVar5 == 0);
    if (iVar5 == 1) {
      pcVar2 = (code *)swi(3);
      uVar4 = (*pcVar2)();
      return uVar4;
    }
  }
LAB_0010b713:
  do {
    fVar6 = (float)SDL_sqrtf(in_RSI[2] * in_RSI[2] + *in_RSI * *in_RSI + in_RSI[1] * in_RSI[1]);
    fVar6 = (float)SDL_fabsf(fVar6 - 1.0);
    if (fVar6 <= 1e-05) goto LAB_0010b7f9;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_10,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x16d);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010b7f9:
  do {
    fVar6 = (float)SDL_sqrtf(in_RSI[5] * in_RSI[5] + in_RSI[3] * in_RSI[3] + in_RSI[4] * in_RSI[4]);
    fVar6 = (float)SDL_fabsf(fVar6 - 1.0);
    if (fVar6 <= 1e-05) goto LAB_0010b8e1;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_11,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x16e);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010b8e1:
  do {
    fVar6 = (float)SDL_fabsf(in_RSI[2] * in_RSI[5] + *in_RSI * in_RSI[3] + in_RSI[1] * in_RSI[4]);
    if (fVar6 <= 1e-05) goto LAB_0010b9b1;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_12,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x16f);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010b9b1:
  if (*in_RDX == 0) {
    if ((in_ECX & 0x40) != 0) {
      do {
        fVar6 = (float)SDL_sqrtf(*(float *)(in_RDX + 2) * *(float *)(in_RDX + 2) +
                                 *(float *)(in_RDX + 1) * *(float *)(in_RDX + 1) +
                                 *(float *)((long)in_RDX + 0xc) * *(float *)((long)in_RDX + 0xc));
        fVar6 = (float)SDL_fabsf(fVar6 - 1.0);
        if (fVar6 <= 1e-05) goto LAB_0010bc2a;
        iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_15,
                                    "F3DAudioCheckCalculateParams",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                    ,0x17b);
      } while (iVar5 == 0);
      if (iVar5 == 1) {
        pcVar2 = (code *)swi(3);
        uVar4 = (*pcVar2)();
        return uVar4;
      }
    }
  }
  else {
    do {
      fVar6 = (float)SDL_sqrtf(*(float *)(in_RDX + 2) * *(float *)(in_RDX + 2) +
                               *(float *)(in_RDX + 1) * *(float *)(in_RDX + 1) +
                               *(float *)((long)in_RDX + 0xc) * *(float *)((long)in_RDX + 0xc));
      fVar6 = (float)SDL_fabsf(fVar6 - 1.0);
      if (fVar6 <= 1e-05) goto LAB_0010bab1;
      iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_13,
                                  "F3DAudioCheckCalculateParams",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x173);
    } while (iVar5 == 0);
    if (iVar5 == 1) {
      pcVar2 = (code *)swi(3);
      uVar4 = (*pcVar2)();
      return uVar4;
    }
LAB_0010bab1:
    do {
      uVar4 = CheckCone((F3DAUDIO_CONE *)
                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      if (uVar4 == '\x01') goto LAB_0010bc2a;
      iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_14,
                                  "F3DAudioCheckCalculateParams",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x177);
    } while (iVar5 == 0);
    if (iVar5 == 1) {
      pcVar2 = (code *)swi(3);
      uVar4 = (*pcVar2)();
      return uVar4;
    }
  }
LAB_0010bc2a:
  if (1 < *(uint *)(in_RDX + 8)) {
    do {
      fVar6 = (float)SDL_sqrtf(*(float *)(in_RDX + 2) * *(float *)(in_RDX + 2) +
                               *(float *)(in_RDX + 1) * *(float *)(in_RDX + 1) +
                               *(float *)((long)in_RDX + 0xc) * *(float *)((long)in_RDX + 0xc));
      fVar6 = (float)SDL_fabsf(fVar6 - 1.0);
      if (fVar6 <= 1e-05) goto LAB_0010bd28;
      iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_16,
                                  "F3DAudioCheckCalculateParams",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x180);
    } while (iVar5 == 0);
    if (iVar5 == 1) {
      pcVar2 = (code *)swi(3);
      uVar4 = (*pcVar2)();
      return uVar4;
    }
LAB_0010bd28:
    do {
      fVar6 = (float)SDL_sqrtf(*(float *)((long)in_RDX + 0x1c) * *(float *)((long)in_RDX + 0x1c) +
                               *(float *)((long)in_RDX + 0x14) * *(float *)((long)in_RDX + 0x14) +
                               *(float *)(in_RDX + 3) * *(float *)(in_RDX + 3));
      fVar6 = (float)SDL_fabsf(fVar6 - 1.0);
      if (fVar6 <= 1e-05) goto LAB_0010be10;
      iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_17,
                                  "F3DAudioCheckCalculateParams",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x181);
    } while (iVar5 == 0);
    if (iVar5 == 1) {
      pcVar2 = (code *)swi(3);
      uVar4 = (*pcVar2)();
      return uVar4;
    }
LAB_0010be10:
    do {
      fVar6 = (float)SDL_fabsf(*(float *)(in_RDX + 2) * *(float *)((long)in_RDX + 0x1c) +
                               *(float *)(in_RDX + 1) * *(float *)((long)in_RDX + 0x14) +
                               *(float *)((long)in_RDX + 0xc) * *(float *)(in_RDX + 3));
      if (fVar6 <= 1e-05) goto LAB_0010bee0;
      iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_18,
                                  "F3DAudioCheckCalculateParams",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x182);
    } while (iVar5 == 0);
    if (iVar5 == 1) {
      pcVar2 = (code *)swi(3);
      uVar4 = (*pcVar2)();
      return uVar4;
    }
  }
LAB_0010bee0:
  do {
    if (0.0 <= *(float *)(in_RDX + 7)) goto LAB_0010bf4d;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_19,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x184);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010bf4d:
  do {
    if (*(float *)(in_RDX + 7) <= 3.4028235e+38) goto LAB_0010bfbb;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_20,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x184);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010bfbb:
  do {
    if (0.0 <= *(float *)((long)in_RDX + 0x3c)) goto LAB_0010c028;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_21,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x185);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010c028:
  do {
    if (*(float *)((long)in_RDX + 0x3c) <= 1.5707964) goto LAB_0010c096;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_22,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x185);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010c096:
  do {
    if ((int)in_RDX[8] != 0) goto LAB_0010c0fc;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_23,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x189);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010c0fc:
  do {
    if (0.0 <= *(float *)((long)in_RDX + 0x44)) goto LAB_0010c163;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_24,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x18d);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010c163:
  if (1 < *(uint *)(in_RDX + 8)) {
    do {
      if (in_RDX[9] != 0) goto LAB_0010c1dc;
      iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_25,
                                  "F3DAudioCheckCalculateParams",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                  ,0x193);
    } while (iVar5 == 0);
    if (iVar5 == 1) {
      pcVar2 = (code *)swi(3);
      uVar4 = (*pcVar2)();
      return uVar4;
    }
LAB_0010c1dc:
    if (in_RDX[9] != 0) {
      for (local_2c = 0; local_2c < *(uint *)(in_RDX + 8); local_2c = local_2c + 1) {
        fVar6 = *(float *)(in_RDX[9] + (ulong)local_2c * 4);
        do {
          if (0.0 <= fVar6) goto LAB_0010c29a;
          iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_26,
                                      "F3DAudioCheckCalculateParams",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                      ,0x199);
        } while (iVar5 == 0);
        if (iVar5 == 1) {
          pcVar2 = (code *)swi(3);
          uVar4 = (*pcVar2)();
          return uVar4;
        }
LAB_0010c29a:
        do {
          if (fVar6 <= 6.2831855) goto LAB_0010c2fb;
          iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_27,
                                      "F3DAudioCheckCalculateParams",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                      ,0x199);
        } while (iVar5 == 0);
        if (iVar5 == 1) {
          pcVar2 = (code *)swi(3);
          uVar4 = (*pcVar2)();
          return uVar4;
        }
LAB_0010c2fb:
        if ((fVar6 == 6.2831855) && (!NAN(fVar6))) {
          do {
            if ((in_ECX & 0x20000) == 0) goto LAB_0010c37e;
            iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_28,
                                        "F3DAudioCheckCalculateParams",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                        ,0x1a1);
          } while (iVar5 == 0);
          if (iVar5 == 1) {
            pcVar2 = (code *)swi(3);
            uVar4 = (*pcVar2)();
            return uVar4;
          }
        }
LAB_0010c37e:
      }
    }
  }
  do {
    if (1.1754944e-38 <= *(float *)(in_RDX + 0xf)) goto LAB_0010c410;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_29,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x1a6);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010c410:
  do {
    if (*(float *)(in_RDX + 0xf) <= 3.4028235e+38) goto LAB_0010c47e;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_30,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x1a6);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010c47e:
  do {
    if (0.0 <= *(float *)((long)in_RDX + 0x7c)) goto LAB_0010c4eb;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_31,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x1a7);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010c4eb:
  do {
    if (*(float *)((long)in_RDX + 0x7c) <= 3.4028235e+38) goto LAB_0010c559;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_32,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x1a7);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010c559:
  do {
    uVar4 = CheckCurve((F3DAUDIO_DISTANCE_CURVE *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (uVar4 == '\x01') goto LAB_0010c5ca;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_33,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x1ac);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010c5ca:
  do {
    uVar4 = CheckCurve((F3DAUDIO_DISTANCE_CURVE *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (uVar4 == '\x01') goto LAB_0010c63b;
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_34,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x1b0);
  } while (iVar5 == 0);
  if (iVar5 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010c63b:
  do {
    uVar4 = CheckCurve((F3DAUDIO_DISTANCE_CURVE *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (uVar4 == '\x01') goto LAB_0010c6ac;
    in_stack_ffffffffffffff2c =
         SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_35,
                             "F3DAudioCheckCalculateParams",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                             ,0x1b4);
  } while (in_stack_ffffffffffffff2c == 0);
  if (in_stack_ffffffffffffff2c == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010c6ac:
  do {
    uVar4 = CheckCurve((F3DAUDIO_DISTANCE_CURVE *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (uVar4 == '\x01') goto LAB_0010c71d;
    in_stack_ffffffffffffff28 =
         SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_36,
                             "F3DAudioCheckCalculateParams",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                             ,0x1b8);
  } while (in_stack_ffffffffffffff28 == 0);
  if (in_stack_ffffffffffffff28 == 1) {
    pcVar2 = (code *)swi(3);
    uVar4 = (*pcVar2)();
    return uVar4;
  }
LAB_0010c71d:
  do {
    uVar4 = CheckCurve((F3DAUDIO_DISTANCE_CURVE *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    if (uVar4 == '\x01') {
      return '\x01';
    }
    iVar5 = SDL_ReportAssertion(&F3DAudioCheckCalculateParams::sdl_assert_data_37,
                                "F3DAudioCheckCalculateParams",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/F3DAudio.c"
                                ,0x1bc);
  } while (iVar5 == 0);
  if (iVar5 != 1) {
    return '\x01';
  }
  pcVar2 = (code *)swi(3);
  uVar4 = (*pcVar2)();
  return uVar4;
}

Assistant:

F3DAUDIOAPI uint8_t F3DAudioCheckCalculateParams(
	const F3DAUDIO_HANDLE Instance,
	const F3DAUDIO_LISTENER *pListener,
	const F3DAUDIO_EMITTER *pEmitter,
	uint32_t Flags,
	F3DAUDIO_DSP_SETTINGS *pDSPSettings
) {
	uint32_t i, ChannelCount;

	POINTER_CHECK(Instance);
	POINTER_CHECK(pListener);
	POINTER_CHECK(pEmitter);
	POINTER_CHECK(pDSPSettings);

	if (Flags & F3DAUDIO_CALCULATE_MATRIX)
	{
		POINTER_CHECK(pDSPSettings->pMatrixCoefficients);
	}
	if (Flags & F3DAUDIO_CALCULATE_ZEROCENTER)
	{
		const uint32_t isCalculateMatrix = (Flags & F3DAUDIO_CALCULATE_MATRIX);
		const uint32_t hasCenter = SPEAKERMASK(Instance) & SPEAKER_FRONT_CENTER;
		PARAM_CHECK(
			isCalculateMatrix && hasCenter,
			"F3DAUDIO_CALCULATE_ZEROCENTER is only valid for matrix"
			" calculations with an output format that has a center channel"
		);
	}

	if (Flags & F3DAUDIO_CALCULATE_REDIRECT_TO_LFE)
	{
		const uint32_t isCalculateMatrix = (Flags & F3DAUDIO_CALCULATE_MATRIX);
		const uint32_t hasLF = SPEAKERMASK(Instance) & SPEAKER_LOW_FREQUENCY;
		PARAM_CHECK(
			isCalculateMatrix && hasLF,
			"F3DAUDIO_CALCULATE_REDIRECT_TO_LFE is only valid for matrix"
			" calculations with an output format that has a low-frequency"
			" channel"
		);
	}

	ChannelCount = SPEAKERCOUNT(Instance);
	PARAM_CHECK(
		pDSPSettings->DstChannelCount == ChannelCount,
		"Invalid channel count, DSP settings and speaker configuration must agree"
	);
	PARAM_CHECK(
		pDSPSettings->SrcChannelCount == pEmitter->ChannelCount,
		"Invalid channel count, DSP settings and emitter must agree"
	);

	if (pListener->pCone)
	{
		PARAM_CHECK(
			CheckCone(pListener->pCone) == PARAM_CHECK_OK,
			"Invalid listener cone"
		);
	}
	VECTOR_NORMAL_CHECK(pListener->OrientFront);
	VECTOR_NORMAL_CHECK(pListener->OrientTop);
	VECTOR_BASE_CHECK(pListener->OrientFront, pListener->OrientTop);

	if (pEmitter->pCone)
	{
		VECTOR_NORMAL_CHECK(pEmitter->OrientFront);
		PARAM_CHECK(
			CheckCone(pEmitter->pCone) == PARAM_CHECK_OK,
			"Invalid emitter cone"
		);
	}
	else if (Flags & F3DAUDIO_CALCULATE_EMITTER_ANGLE)
	{
		VECTOR_NORMAL_CHECK(pEmitter->OrientFront);
	}
	if (pEmitter->ChannelCount > 1)
	{
		/* Only used for multi-channel emitters */
		VECTOR_NORMAL_CHECK(pEmitter->OrientFront);
		VECTOR_NORMAL_CHECK(pEmitter->OrientTop);
		VECTOR_BASE_CHECK(pEmitter->OrientFront, pEmitter->OrientTop);
	}
	FLOAT_BETWEEN_CHECK(pEmitter->InnerRadius, 0.0f, FLT_MAX);
	FLOAT_BETWEEN_CHECK(pEmitter->InnerRadiusAngle, 0.0f, F3DAUDIO_2PI / 4.0f);
	PARAM_CHECK(
		pEmitter->ChannelCount > 0,
		"Invalid channel count for emitter"
	);
	PARAM_CHECK(
		pEmitter->ChannelRadius >= 0.0f,
		"Invalid channel radius for emitter"
	);
	if (pEmitter->ChannelCount > 1)
	{
		PARAM_CHECK(
			pEmitter->pChannelAzimuths != NULL,
			"Invalid channel azimuths for multi-channel emitter"
		);
		if (pEmitter->pChannelAzimuths)
		{
			for (i = 0; i < pEmitter->ChannelCount; i += 1)
			{
				float currentAzimuth = pEmitter->pChannelAzimuths[i];
				FLOAT_BETWEEN_CHECK(currentAzimuth, 0.0f, F3DAUDIO_2PI);
				if (currentAzimuth == F3DAUDIO_2PI)
				{
					PARAM_CHECK(
						!(Flags & F3DAUDIO_CALCULATE_REDIRECT_TO_LFE),
						"F3DAUDIO_CALCULATE_REDIRECT_TO_LFE valid only for"
						" matrix calculations with emitters that have no LFE"
						" channel"
					);
				}
			}
		}
	}
	FLOAT_BETWEEN_CHECK(pEmitter->CurveDistanceScaler, FLT_MIN, FLT_MAX);
	FLOAT_BETWEEN_CHECK(pEmitter->DopplerScaler, 0.0f, FLT_MAX);

	PARAM_CHECK(
		CheckCurve(pEmitter->pVolumeCurve) == PARAM_CHECK_OK,
		"Invalid Volume curve"
	);
	PARAM_CHECK(
		CheckCurve(pEmitter->pLFECurve) == PARAM_CHECK_OK,
		"Invalid LFE curve"
	);
	PARAM_CHECK(
		CheckCurve(pEmitter->pLPFDirectCurve) == PARAM_CHECK_OK,
		"Invalid LPFDirect curve"
	);
	PARAM_CHECK(
		CheckCurve(pEmitter->pLPFReverbCurve) == PARAM_CHECK_OK,
		"Invalid LPFReverb curve"
	);
	PARAM_CHECK(
		CheckCurve(pEmitter->pReverbCurve) == PARAM_CHECK_OK,
		"Invalid Reverb curve"
	);

	return PARAM_CHECK_OK;
}